

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

Station * __thiscall imrt::Station::operator=(Station *this,Station *s)

{
  _Base_ptr p_Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  const_iterator cVar5;
  mapped_type *ppMVar6;
  Matrix local_40;
  
  Collimator::operator=(this->collimator,s->collimator);
  this->angle = s->angle;
  iVar4 = s->max_intensity;
  iVar2 = s->min_intensity;
  iVar3 = s->initial_intensity;
  this->max_apertures = s->max_apertures;
  this->max_intensity = iVar4;
  this->min_intensity = iVar2;
  this->initial_intensity = iVar3;
  this->step_intensity = s->step_intensity;
  iVar4 = s->n_volumes;
  this->n_volumes = iVar4;
  for (local_40.rows_ = 0; local_40.rows_ < iVar4; local_40.rows_ = local_40.rows_ + 1) {
    cVar5 = std::
            _Rb_tree<int,_std::pair<const_int,_const_maths::Matrix_*>,_std::_Select1st<std::pair<const_int,_const_maths::Matrix_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
            ::find(&(s->D)._M_t,&local_40.rows_);
    p_Var1 = cVar5._M_node[1]._M_parent;
    ppMVar6 = std::
              map<int,_const_maths::Matrix_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
              ::operator[](&this->D,&local_40.rows_);
    *ppMVar6 = (mapped_type)p_Var1;
    iVar4 = this->n_volumes;
  }
  maths::Matrix::Matrix(&local_40,&s->I);
  maths::Matrix::operator=(&this->I,&local_40);
  maths::Matrix::~Matrix(&local_40);
  std::vector<double,_std::allocator<double>_>::operator=(&this->intensity,&s->intensity);
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::operator=(&this->A,&s->A);
  (this->last_mem).first = (s->last_mem).first;
  (this->last_mem).second = (s->last_mem).second;
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
            (&this->last_diff,&s->last_diff);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::operator=(&(this->pos2beam)._M_t,&(s->pos2beam)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_int,_std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  ::operator=(&(this->beam2pos)._M_t,&(s->beam2pos)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=(&(this->int2nb)._M_t,&(s->int2nb)._M_t);
  return this;
}

Assistant:

Station& Station::operator=(const Station & s) {
    collimator=s.collimator;
    angle=s.angle;
    max_apertures=s.max_apertures;
    max_intensity=s.max_intensity;
    min_intensity=s.min_intensity;
    initial_intensity=s.initial_intensity;
    step_intensity=s.step_intensity;
    n_volumes=s.n_volumes;
    for (int i=0; i<n_volumes; i++) {
      const Matrix * aux= s.D.find(i)->second;
      D[i]=aux;
    }
    I= Matrix (s.I);
    //I= s.I;
    intensity=s.intensity;
    A=s.A;
    last_mem=s.last_mem;
    last_diff=s.last_diff;
    pos2beam=s.pos2beam;
    beam2pos=s.beam2pos;
    int2nb=s.int2nb;

    return(*this);
  }